

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int __thiscall Widget_Browser::item_height(Widget_Browser *this,void *l)

{
  Fl_Fontsize FVar1;
  char *pcVar2;
  Fl_Type *t;
  void *l_local;
  Widget_Browser *this_local;
  
  if (*(char *)((long)l + 0x43) == '\0') {
    this_local._4_4_ = 0;
  }
  else {
    if ((show_comments != 0) && (pcVar2 = Fl_Type::comment((Fl_Type *)l), pcVar2 != (char *)0x0)) {
      FVar1 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
      return FVar1 * 2 + 4;
    }
    FVar1 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
    this_local._4_4_ = FVar1 + 5;
  }
  return this_local._4_4_;
}

Assistant:

int Widget_Browser::item_height(void *l) const {
  Fl_Type *t = (Fl_Type*)l;
  if (t->visible) {
    if (show_comments && t->comment())
      return textsize()*2+4;
    else
      return textsize()+5;
  }
  return 0;
}